

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int n;
  ulong uVar5;
  float fVar6;
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      auVar2 = vmaxss_avx(ZEXT416((uint)(items->Width - width_excess)),ZEXT416(0x3f800000));
      items->Width = auVar2._0_4_;
    }
  }
  else {
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    if ((1 < count) && (0.0 < width_excess)) {
      uVar4 = 1;
      do {
        fVar6 = items->Width;
        uVar4 = (ulong)(int)uVar4;
        do {
          fVar1 = items[uVar4].Width;
          if (fVar1 < fVar6) {
            if (0.0 <= fVar1) {
              fVar6 = fVar6 - fVar1;
              goto LAB_0016a51f;
            }
            break;
          }
          uVar4 = uVar4 + 1;
        } while ((long)uVar4 < (long)count);
        fVar6 = fVar6 + -1.0;
LAB_0016a51f:
        if (fVar6 <= 0.0) break;
        iVar3 = (int)uVar4;
        auVar2 = vminss_avx(ZEXT416((uint)(width_excess / (float)iVar3)),ZEXT416((uint)fVar6));
        if (0 < iVar3) {
          uVar5 = 0;
          do {
            items[uVar5].Width = items[uVar5].Width - auVar2._0_4_;
            uVar5 = uVar5 + 1;
          } while ((uVar4 & 0xffffffff) != uVar5);
        }
        if ((count <= iVar3) ||
           (width_excess = width_excess - auVar2._0_4_ * (float)iVar3, width_excess <= 0.0)) break;
      } while( true );
    }
    if (0 < count) {
      fVar6 = 0.0;
      uVar4 = 0;
      do {
        auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)items[uVar4].Width));
        fVar6 = fVar6 + (items[uVar4].Width - auVar2._0_4_);
        items[uVar4].Width = auVar2._0_4_;
        uVar4 = uVar4 + 1;
      } while ((uint)count != uVar4);
      if (0.0 < fVar6 && 0 < count) {
        uVar4 = 0;
        do {
          if (items[uVar4].Index < (int)(fVar6 + 0.01)) {
            items[uVar4].Width = items[uVar4].Width + 1.0;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)count != uVar4);
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}